

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * pbrt::Perspective(Float fov,Float n,Float f)

{
  Transform *in_RDI;
  Float in_XMM0_Da;
  Float FVar1;
  undefined1 extraout_var [12];
  undefined1 auVar2 [16];
  Float invTanAng;
  SquareMatrix<4> persp;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  Float in_stack_fffffffffffffecc;
  SquareMatrix<4> *in_stack_fffffffffffffed0;
  Transform *in_stack_fffffffffffffee8;
  Transform *in_stack_fffffffffffffef0;
  SquareMatrix<4> *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  Float in_stack_ffffffffffffff2c;
  Float in_stack_ffffffffffffff30;
  Float in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  
  SquareMatrix<4>::SquareMatrix<int,int,int,int,int,int,int,int,int,float,float,int,int,int,int>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             in_stack_fffffffffffffeb8,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_fffffffffffffeb4,
             in_stack_fffffffffffffeb0,(int)in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  FVar1 = Radians(in_XMM0_Da);
  auVar2._0_4_ = FVar1 / 2.0;
  auVar2._4_12_ = extraout_var;
  std::tan(auVar2._0_8_);
  Scale(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  Transform::Transform
            ((Transform *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  Transform::operator*(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU Transform Perspective(Float fov, Float n, Float f) {
    // Perform projective divide for perspective projection
    // clang-format off
SquareMatrix<4> persp(1, 0,           0,              0,
                      0, 1,           0,              0,
                      0, 0, f / (f - n), -f*n / (f - n),
                      0, 0,           1,              0);
    // clang-format on

    // Scale canonical perspective view to specified field of view
    Float invTanAng = 1 / std::tan(Radians(fov) / 2);
    return Scale(invTanAng, invTanAng, 1) * Transform(persp);
}